

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O3

int luaopen_stm(lua_State *L)

{
  luaL_Reg reader [2];
  luaL_Reg writer [2];
  luaL_Reg local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  luaL_Reg local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,3);
  lua_pushcclosure(L,lcopy,0);
  lua_setfield(L,-2,"copy");
  local_38 = 0;
  uStack_30 = 0;
  local_48.name = "new";
  local_48.func = lnewwriter;
  lua_createtable(L,0,2);
  lua_pushcclosure(L,ldeletewriter,0);
  lua_setfield(L,-2,"__gc");
  lua_pushcclosure(L,lupdate,0);
  lua_setfield(L,-2,"__call");
  luaL_setfuncs(L,&local_48,1);
  local_58 = 0;
  uStack_50 = 0;
  local_68.name = "newcopy";
  local_68.func = lnewreader;
  lua_createtable(L,0,2);
  lua_pushcclosure(L,ldeletereader,0);
  lua_setfield(L,-2,"__gc");
  lua_pushcclosure(L,lread,0);
  lua_setfield(L,-2,"__call");
  luaL_setfuncs(L,&local_68,1);
  return 1;
}

Assistant:

int
luaopen_stm(lua_State *L) {
	luaL_checkversion(L);
	lua_createtable(L, 0, 3);

	lua_pushcfunction(L, lcopy);
	lua_setfield(L, -2, "copy");

	luaL_Reg writer[] = {
		{ "new", lnewwriter },
		{ NULL, NULL },
	};
	lua_createtable(L, 0, 2);
	lua_pushcfunction(L, ldeletewriter),
	lua_setfield(L, -2, "__gc");
	lua_pushcfunction(L, lupdate),
	lua_setfield(L, -2, "__call");
	luaL_setfuncs(L, writer, 1);

	luaL_Reg reader[] = {
		{ "newcopy", lnewreader },
		{ NULL, NULL },
	};
	lua_createtable(L, 0, 2);
	lua_pushcfunction(L, ldeletereader),
	lua_setfield(L, -2, "__gc");
	lua_pushcfunction(L, lread),
	lua_setfield(L, -2, "__call");
	luaL_setfuncs(L, reader, 1);

	return 1;
}